

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret.hpp
# Opt level: O0

void __thiscall
duckdb::BaseSecret::BaseSecret
          (BaseSecret *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *prefix_paths_p,string *type_p,string *provider_p,string *name_p)

{
  string *in_RCX;
  string *in_RDX;
  undefined8 *in_RDI;
  string *in_R8;
  
  *in_RDI = std::_Hash_bytes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)in_RCX,
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)in_RDX);
  std::__cxx11::string::string((string *)(in_RDI + 4),in_RDX);
  std::__cxx11::string::string((string *)(in_RDI + 8),in_RCX);
  std::__cxx11::string::string((string *)(in_RDI + 0xc),in_R8);
  *(undefined1 *)(in_RDI + 0x10) = 0;
  return;
}

Assistant:

BaseSecret(vector<string> prefix_paths_p, string type_p, string provider_p, string name_p)
	    : prefix_paths(std::move(prefix_paths_p)), type(std::move(type_p)), provider(std::move(provider_p)),
	      name(std::move(name_p)), serializable(false) {
		D_ASSERT(!type.empty());
	}